

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  bool bVar1;
  ImGuiID IVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *this;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 uVar8;
  undefined4 uVar9;
  ImGuiContext *pIVar10;
  int iVar11;
  ImU32 col;
  ImGuiContext *pIVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 local_58 [16];
  ImVec4 local_48;
  
  pIVar10 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  if (type != (char *)0x0) {
    if ((GImGui->DragDropPayload).DataFrameCount == -1) {
      return (ImGuiPayload *)0x0;
    }
    iVar11 = strcmp(type,(GImGui->DragDropPayload).DataType);
    if (iVar11 != 0) {
      return (ImGuiPayload *)0x0;
    }
  }
  IVar2 = pIVar10->DragDropTargetId;
  IVar3 = pIVar10->DragDropAcceptIdPrev;
  auVar15._8_8_ = 0;
  auVar15._0_4_ = (pIVar10->DragDropTargetRect).Min.x;
  auVar15._4_4_ = (pIVar10->DragDropTargetRect).Min.y;
  auVar16._8_8_ = 0;
  auVar16._0_4_ = (pIVar10->DragDropTargetRect).Max.x;
  auVar16._4_4_ = (pIVar10->DragDropTargetRect).Max.y;
  auVar14 = vsubps_avx(auVar16,auVar15);
  auVar13 = vmovshdup_avx(auVar14);
  fVar5 = auVar14._0_4_ * auVar13._0_4_;
  if (fVar5 < pIVar10->DragDropAcceptIdCurrRectSurface) {
    pIVar10->DragDropAcceptFlags = flags;
    pIVar10->DragDropAcceptIdCurr = IVar2;
    pIVar10->DragDropAcceptIdCurrRectSurface = fVar5;
  }
  (pIVar10->DragDropPayload).Preview = IVar3 == IVar2;
  if (((pIVar10->DragDropSourceFlags | flags) & 0x800U) == 0 && IVar3 == IVar2) {
    auVar13._8_4_ = 0xc0600000;
    auVar13._0_8_ = 0xc0600000c0600000;
    auVar13._12_4_ = 0xc0600000;
    auVar13 = vaddps_avx512vl(auVar15,auVar13);
    auVar14._8_4_ = 0x40600000;
    auVar14._0_8_ = 0x4060000040600000;
    auVar14._12_4_ = 0x40600000;
    auVar14 = vaddps_avx512vl(auVar16,auVar14);
    local_58 = vmovlhps_avx(auVar13,auVar14);
    if (((auVar13._0_4_ < (pIVar4->ClipRect).Min.x) ||
        (auVar15 = vmovshdup_avx(auVar13), auVar15._0_4_ < (pIVar4->ClipRect).Min.y)) ||
       ((pIVar4->ClipRect).Max.x < auVar14._0_4_)) {
LAB_002376a9:
      auVar6._8_4_ = 0xbf800000;
      auVar6._0_8_ = 0xbf800000bf800000;
      auVar6._12_4_ = 0xbf800000;
      auVar13 = vaddps_avx512vl(auVar13,auVar6);
      auVar7._8_4_ = 0x3f800000;
      auVar7._0_8_ = 0x3f8000003f800000;
      auVar7._12_4_ = 0x3f800000;
      auVar14 = vaddps_avx512vl(auVar14,auVar7);
      bVar1 = false;
      ImDrawList::PushClipRect(pIVar4->DrawList,auVar13._0_8_,auVar14._0_8_,false);
      pIVar12 = GImGui;
    }
    else {
      auVar15 = vmovshdup_avx(auVar14);
      bVar1 = true;
      pIVar12 = pIVar10;
      if ((pIVar4->ClipRect).Max.y < auVar15._0_4_) goto LAB_002376a9;
    }
    local_48.x = (pIVar12->Style).Colors[0x2b].x;
    local_48.y = (pIVar12->Style).Colors[0x2b].y;
    uVar8 = (pIVar12->Style).Colors[0x2b].z;
    uVar9 = (pIVar12->Style).Colors[0x2b].w;
    this = pIVar4->DrawList;
    local_48.w = (pIVar12->Style).Alpha * (float)uVar9;
    local_48.z = (float)uVar8;
    col = ColorConvertFloat4ToU32(&local_48);
    ImDrawList::AddRect(this,(ImVec2 *)local_58,(ImVec2 *)(local_58 + 8),col,0.0,-1,2.0);
    if (!bVar1) {
      ImDrawList::PopClipRect(pIVar4->DrawList);
    }
  }
  pIVar10->DragDropAcceptFrameCount = pIVar10->FrameCount;
  if (IVar3 == IVar2) {
    bVar1 = (GImGui->IO).MouseDown[pIVar10->DragDropMouseButton];
    (pIVar10->DragDropPayload).Delivery = (bool)(bVar1 ^ 1);
    if ((((uint)flags >> 10 & 1) != 0) || (bVar1 == false)) {
LAB_0023778d:
      return &pIVar10->DragDropPayload;
    }
  }
  else {
    (pIVar10->DragDropPayload).Delivery = false;
    if (((uint)flags >> 10 & 1) != 0) goto LAB_0023778d;
  }
  return (ImGuiPayload *)0x0;
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface < g.DragDropAcceptIdCurrRectSurface)
    {
        g.DragDropAcceptFlags = flags;
        g.DragDropAcceptIdCurr = g.DragDropTargetId;
        g.DragDropAcceptIdCurrRectSurface = r_surface;
    }

    // Render default drop visuals
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that lives for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
    {
        // FIXME-DRAG: Settle on a proper default visuals for drop target.
        r.Expand(3.5f);
        bool push_clip_rect = !window->ClipRect.Contains(r);
        if (push_clip_rect) window->DrawList->PushClipRect(r.Min-ImVec2(1,1), r.Max+ImVec2(1,1));
        window->DrawList->AddRect(r.Min, r.Max, GetColorU32(ImGuiCol_DragDropTarget), 0.0f, ~0, 2.0f);
        if (push_clip_rect) window->DrawList->PopClipRect();
    }

    g.DragDropAcceptFrameCount = g.FrameCount;
    payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting os window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    return &payload;
}